

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::ConsoleReporter::getTildes_abi_cxx11_(void)

{
  int iVar1;
  allocator local_9;
  
  if (getTildes[abi:cxx11]()::dots_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getTildes[abi:cxx11]()::dots_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)getTildes[abi:cxx11]()::dots_abi_cxx11_,0x4f,'~',&local_9);
      std::allocator<char>::~allocator((allocator<char> *)&local_9);
      __cxa_atexit(std::__cxx11::string::~string,getTildes[abi:cxx11]()::dots_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getTildes[abi:cxx11]()::dots_abi_cxx11_);
    }
  }
  return (string *)getTildes[abi:cxx11]()::dots_abi_cxx11_;
}

Assistant:

static std::string const& getTildes() {
            static const std::string dots( CATCH_CONFIG_CONSOLE_WIDTH-1, '~' );
            return dots;
        }